

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O3

ch_upvalue * ch_loadupvalue(ch_primitive *value)

{
  ch_upvalue *pcVar1;
  
  pcVar1 = (ch_upvalue *)malloc(0x28);
  (pcVar1->object).type = TYPE_UPVALUE;
  pcVar1->value = value;
  (pcVar1->closed).type = PRIMITIVE_NULL;
  (pcVar1->closed).field_1.number_value = 0.0;
  pcVar1->next = (ch_upvalue *)0x0;
  return pcVar1;
}

Assistant:

ch_upvalue *ch_loadupvalue(ch_primitive* value) {
  ch_upvalue *upvalue = malloc(sizeof(ch_upvalue));
  upvalue->object.type = TYPE_UPVALUE;
  upvalue->value = value;
  upvalue->next = NULL;
  upvalue->closed = MAKE_NULL();

  return upvalue;
}